

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O1

void __thiscall lsim::SimCircuit::write_output_pins(SimCircuit *this,uint32_t comp_id,uint64_t data)

{
  SimComponent *this_00;
  uint32_t uVar1;
  ulong uVar2;
  
  this_00 = component_by_id(this,comp_id);
  if (this_00 != (SimComponent *)0x0) {
    uVar1 = this_00->m_output_start;
    if (this_00->m_control_start != uVar1) {
      uVar2 = 0;
      do {
        SimComponent::set_user_value
                  (this_00,uVar1 + (int)uVar2,(uint)((data >> (uVar2 & 0x3f) & 1) != 0));
        uVar1 = this_00->m_output_start;
        uVar2 = uVar2 + 1;
      } while ((uint)uVar2 < this_00->m_control_start - uVar1);
    }
    return;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0xa0,"void lsim::SimCircuit::write_output_pins(uint32_t, uint64_t)");
}

Assistant:

void SimCircuit::write_output_pins(uint32_t comp_id, uint64_t data) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    for (auto idx = 0u; idx < comp->num_outputs(); ++idx) {
        comp->set_user_value(comp->output_pin_index(idx), static_cast<Value>((data >> idx) & 1));
    }
}